

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::async_win_del_var(Nvim *this,Window window,string *name)

{
  string local_50;
  Window local_30;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_30 = window;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"nvim_win_del_var","");
  NvimRPC::async_call<long,std::__cxx11::string>(&this->client_,&local_50,&local_30,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_win_del_var(Window window, const std::string& name) {
    client_.async_call("nvim_win_del_var", window, name);
}